

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crypto_tests.cpp
# Opt level: O3

void __thiscall
crypto_tests::CryptoTest::TestFSChaCha20
          (CryptoTest *this,string *hex_plaintext,string *hexkey,uint32_t rekey_interval,
          string *ciphertext_after_rotation)

{
  long lVar1;
  byte *pbVar2;
  readonly_property<bool> rVar3;
  int iVar4;
  long lVar5;
  ulong uVar6;
  ChaCha20 *pCVar7;
  ChaCha20 *pCVar8;
  string *psVar9;
  iterator in_R9;
  iterator pvVar10;
  iterator pvVar11;
  long in_FS_OFFSET;
  byte bVar12;
  string_view hex_str;
  const_string file;
  string_view hex_str_00;
  Span<const_std::byte> key_00;
  Span<const_std::byte> key_01;
  Span<const_std::byte> input;
  Span<const_std::byte> input_00;
  const_string file_00;
  Span<const_std::byte> input_01;
  Span<const_std::byte> input_02;
  const_string file_01;
  Span<std::byte> out;
  Span<const_std::byte> key_02;
  Span<const_std::byte> input_03;
  const_string file_02;
  const_string file_03;
  Span<const_unsigned_char> s;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  Span<std::byte> output;
  Span<std::byte> output_00;
  Span<std::byte> output_01;
  Span<std::byte> output_02;
  Span<std::byte> output_03;
  check_type cVar13;
  undefined1 local_3c8 [16];
  undefined1 *local_3b8;
  char *local_3b0;
  undefined1 *local_3a8;
  undefined1 *local_3a0;
  char *local_398;
  char *local_390;
  char *local_388;
  char *local_380;
  undefined1 *local_378;
  undefined1 *local_370;
  char *local_368;
  char *local_360;
  char *local_358;
  char *local_350;
  undefined1 *local_348;
  undefined1 *local_340;
  char *local_338;
  char *local_330;
  char *local_328;
  char *local_320;
  undefined1 *local_318;
  undefined1 *local_310;
  char *local_308;
  char *local_300;
  vector<std::byte,_std::allocator<std::byte>_> c20_output;
  vector<std::byte,_std::allocator<std::byte>_> fsc20_output;
  vector<std::byte,_std::allocator<std::byte>_> plaintext;
  undefined1 *local_2a8;
  undefined1 *local_2a0;
  char *local_298;
  char *local_290;
  vector<std::byte,_std::allocator<std::byte>_> key;
  string *local_270;
  assertion_result local_268;
  string **local_250;
  string *local_248;
  assertion_result local_240;
  string **local_228;
  char *local_220;
  char *local_218;
  assertion_result local_210;
  string local_1f8;
  byte new_key [32];
  ChaCha20 c20_copy;
  ChaCha20 c20;
  FSChaCha20 fsc20;
  
  bVar12 = 0;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  hex_str._M_str = (hexkey->_M_dataplus)._M_p;
  hex_str._M_len = hexkey->_M_string_length;
  psVar9 = ciphertext_after_rotation;
  ParseHex<std::byte>(&key,hex_str);
  local_298 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/crypto_tests.cpp";
  local_290 = "";
  local_2a8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2a0 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = &DAT_000000c0;
  file.m_begin = (iterator)&local_298;
  msg.m_end = in_R9;
  msg.m_begin = (iterator)psVar9;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_2a8,msg);
  c20_copy.m_aligned.input[2]._0_1_ = 0;
  c20_copy.m_aligned.input._0_8_ = &PTR__lazy_ostream_013ae088;
  c20_copy.m_aligned.input._16_8_ = boost::unit_test::lazy_ostream::inst;
  c20_copy.m_aligned.input._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_1f8._M_dataplus._M_p =
       (pointer)(key.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                 super__Vector_impl_data._M_finish +
                -(long)key.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                       super__Vector_impl_data._M_start);
  local_240.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       (readonly_property<bool>)((pointer)local_1f8._M_dataplus._M_p == (pointer)0x20);
  local_3c8._0_8_ = &local_1f8;
  local_240.m_message.px = (element_type *)0x0;
  local_240.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_268._0_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/crypto_tests.cpp"
  ;
  local_268.m_message.px = (element_type *)0xe75d3e;
  fsc20.m_chacha20.m_aligned.input._24_8_ = new_key;
  new_key._0_8_ = &FSChaCha20::KEYLEN;
  fsc20.m_chacha20.m_aligned.input[2]._0_1_ = 0;
  fsc20.m_chacha20.m_aligned.input._0_8_ = &PTR__lazy_ostream_013ae108;
  fsc20.m_chacha20.m_aligned.input._16_8_ = boost::unit_test::lazy_ostream::inst;
  c20.m_aligned.input._24_8_ = local_3c8;
  c20.m_aligned.input[2]._0_1_ = 0;
  c20.m_aligned.input._0_8_ = &PTR__lazy_ostream_013ae0c8;
  c20.m_aligned.input._16_8_ = boost::unit_test::lazy_ostream::inst;
  pvVar10 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_240,(lazy_ostream *)&c20_copy,1,2,REQUIRE,0xe851cd,(size_t)&local_268,0xc0,
             &fsc20,"key.size()",&c20);
  boost::detail::shared_count::~shared_count(&local_240.m_message.pn);
  hex_str_00._M_str = (hex_plaintext->_M_dataplus)._M_p;
  hex_str_00._M_len = hex_plaintext->_M_string_length;
  ParseHex<std::byte>(&plaintext,hex_str_00);
  key_00.m_size =
       (long)key.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)key.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
             super__Vector_impl_data._M_start;
  key_00.m_data =
       key.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.super__Vector_impl_data
       ._M_start;
  FSChaCha20::FSChaCha20(&fsc20,key_00,rekey_interval);
  key_01.m_size =
       (long)key.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)key.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
             super__Vector_impl_data._M_start;
  key_01.m_data =
       key.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.super__Vector_impl_data
       ._M_start;
  ChaCha20Aligned::ChaCha20Aligned(&c20.m_aligned,key_01);
  c20.m_bufleft = 0;
  fsc20_output.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  fsc20_output.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  fsc20_output.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<std::byte,_std::allocator<std::byte>_>::resize
            (&fsc20_output,
             (long)plaintext.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)plaintext.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                   super__Vector_impl_data._M_start);
  c20_output.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  c20_output.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  c20_output.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<std::byte,_std::allocator<std::byte>_>::resize
            (&c20_output,
             (long)plaintext.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)plaintext.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                   super__Vector_impl_data._M_start);
  if (rekey_interval != 0) {
    uVar6 = 0;
    do {
      input.m_size = (long)plaintext.super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                           _M_impl.super__Vector_impl_data._M_finish -
                     (long)plaintext.super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                           _M_impl.super__Vector_impl_data._M_start;
      output.m_size =
           (long)fsc20_output.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)fsc20_output.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                 super__Vector_impl_data._M_start;
      input.m_data = plaintext.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                     super__Vector_impl_data._M_start;
      output.m_data =
           fsc20_output.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
           super__Vector_impl_data._M_start;
      FSChaCha20::Crypt(&fsc20,input,output);
      input_00.m_size =
           (long)plaintext.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)plaintext.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                 super__Vector_impl_data._M_start;
      output_00.m_size =
           c20_output.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
           super__Vector_impl_data._M_finish +
           -(long)c20_output.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                  super__Vector_impl_data._M_start;
      input_00.m_data =
           plaintext.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
           super__Vector_impl_data._M_start;
      output_00.m_data =
           c20_output.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
           super__Vector_impl_data._M_start;
      ChaCha20::Crypt(&c20,input_00,output_00);
      local_308 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/crypto_tests.cpp"
      ;
      local_300 = "";
      local_318 = &boost::unit_test::basic_cstring<char_const>::null;
      local_310 = &boost::unit_test::basic_cstring<char_const>::null;
      _cVar13 = 0x361c01;
      file_00.m_end = (iterator)0xd0;
      file_00.m_begin = (iterator)&local_308;
      msg_00.m_end = pvVar10;
      msg_00.m_begin = (iterator)output_00.m_size;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_318,
                 msg_00);
      if ((long)c20_output.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)c20_output.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                super__Vector_impl_data._M_start ==
          (long)fsc20_output.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)fsc20_output.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                super__Vector_impl_data._M_start) {
        rVar3.super_class_property<bool>.value = (class_property<bool>)true;
        output_02.m_size =
             fsc20_output.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
             super__Vector_impl_data._M_start;
        for (output_00.m_size =
                  c20_output.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                  super__Vector_impl_data._M_start;
            output_00.m_size !=
            c20_output.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
            super__Vector_impl_data._M_finish; output_00.m_size = output_00.m_size + 1) {
          if (*output_00.m_size != *output_02.m_size) goto LAB_00361c46;
          output_02.m_size = output_02.m_size + 1;
        }
      }
      else {
LAB_00361c46:
        rVar3.super_class_property<bool>.value = (class_property<bool>)false;
      }
      local_240.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
           (readonly_property<bool>)(readonly_property<bool>)rVar3.super_class_property<bool>.value;
      local_240.m_message.px = (element_type *)0x0;
      local_240.m_message.pn.pi_ = (sp_counted_base *)0x0;
      local_268._0_8_ = "c20_output == fsc20_output";
      local_268.m_message.px = (element_type *)0xe851fa;
      c20_copy.m_aligned.input[2]._0_1_ = 0;
      c20_copy.m_aligned.input._0_8_ = &PTR__lazy_ostream_013ae1c8;
      c20_copy.m_aligned.input._16_8_ = boost::unit_test::lazy_ostream::inst;
      c20_copy.m_aligned.input._24_8_ = &local_268;
      local_328 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/crypto_tests.cpp"
      ;
      local_320 = "";
      pvVar10 = (iterator)0x0;
      boost::test_tools::tt_detail::report_assertion
                (&local_240,(lazy_ostream *)&c20_copy,1,0,WARN,_cVar13,(size_t)&local_328,0xd0);
      boost::detail::shared_count::~shared_count(&local_240.m_message.pn);
      uVar6 = uVar6 + 1;
    } while (uVar6 != rekey_interval);
  }
  input_01.m_size =
       (long)plaintext.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)plaintext.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
             super__Vector_impl_data._M_start;
  output_01.m_size =
       (long)fsc20_output.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)fsc20_output.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
             super__Vector_impl_data._M_start;
  input_01.m_data =
       plaintext.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
       super__Vector_impl_data._M_start;
  output_01.m_data =
       fsc20_output.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
       super__Vector_impl_data._M_start;
  FSChaCha20::Crypt(&fsc20,input_01,output_01);
  pCVar7 = &c20;
  pCVar8 = &c20_copy;
  for (lVar5 = 0x1d; lVar5 != 0; lVar5 = lVar5 + -1) {
    (pCVar8->m_aligned).input[0] = (pCVar7->m_aligned).input[0];
    pCVar7 = (ChaCha20 *)((long)pCVar7 + (ulong)bVar12 * -8 + 4);
    pCVar8 = (ChaCha20 *)((long)pCVar8 + (ulong)bVar12 * -8 + 4);
  }
  input_02.m_size =
       (long)plaintext.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)plaintext.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
             super__Vector_impl_data._M_start;
  output_02.m_size =
       c20_output.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
       super__Vector_impl_data._M_finish +
       -(long)c20_output.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
              super__Vector_impl_data._M_start;
  input_02.m_data =
       plaintext.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
       super__Vector_impl_data._M_start;
  output_02.m_data =
       c20_output.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
       super__Vector_impl_data._M_start;
  ChaCha20::Crypt(&c20,input_02,output_02);
  local_338 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/crypto_tests.cpp";
  local_330 = "";
  local_348 = &boost::unit_test::basic_cstring<char_const>::null;
  local_340 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar13 = 0x361dc4;
  file_01.m_end = (iterator)0xd7;
  file_01.m_begin = (iterator)&local_338;
  msg_01.m_end = pvVar10;
  msg_01.m_begin = (iterator)output_02.m_size;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_348,
             msg_01);
  rVar3.super_class_property<bool>.value = (class_property<bool>)true;
  output_00.m_size =
       c20_output.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
       super__Vector_impl_data._M_start;
  pbVar2 = fsc20_output.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((long)c20_output.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)c20_output.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
            super__Vector_impl_data._M_start ==
      (long)fsc20_output.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)fsc20_output.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
            super__Vector_impl_data._M_start) {
    for (; output_00.m_size !=
           c20_output.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
           super__Vector_impl_data._M_finish; output_00.m_size = output_00.m_size + 1) {
      if (*output_00.m_size != *pbVar2) goto LAB_00361e25;
      pbVar2 = pbVar2 + 1;
    }
    rVar3.super_class_property<bool>.value = (class_property<bool>)false;
  }
LAB_00361e25:
  local_268.m_message.px = (element_type *)0x0;
  local_268.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_228 = (string **)new_key;
  new_key._0_8_ = anon_var_dwarf_780848;
  new_key._8_8_ = (long)"c20_output != fsc20_output" + 0x1a;
  local_240.m_message.px = (element_type *)((ulong)local_240.m_message.px & 0xffffffffffffff00);
  local_240._0_8_ = &PTR__lazy_ostream_013ae1c8;
  local_240.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_358 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/crypto_tests.cpp";
  local_350 = "";
  pvVar10 = (iterator)0x0;
  local_268.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)rVar3.super_class_property<bool>.value;
  boost::test_tools::tt_detail::report_assertion
            (&local_268,(lazy_ostream *)&local_240,1,0,WARN,_cVar13,(size_t)&local_358,0xd7);
  boost::detail::shared_count::~shared_count(&local_268.m_message.pn);
  out.m_size = 0x20;
  out.m_data = new_key;
  ChaCha20::Keystream(&c20_copy,out);
  key_02.m_size = 0x20;
  key_02.m_data = new_key;
  ChaCha20::SetKey(&c20,key_02);
  ChaCha20Aligned::Seek(&c20.m_aligned,(Nonce96)(ZEXT816(1) << 0x40),0);
  c20.m_bufleft = 0;
  input_03.m_size =
       (long)plaintext.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)plaintext.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
             super__Vector_impl_data._M_start;
  output_03.m_size =
       c20_output.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
       super__Vector_impl_data._M_finish +
       -(long)c20_output.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
              super__Vector_impl_data._M_start;
  input_03.m_data =
       plaintext.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
       super__Vector_impl_data._M_start;
  output_03.m_data =
       c20_output.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
       super__Vector_impl_data._M_start;
  ChaCha20::Crypt(&c20,input_03,output_03);
  local_368 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/crypto_tests.cpp";
  local_360 = "";
  local_378 = &boost::unit_test::basic_cstring<char_const>::null;
  local_370 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar13 = 0x361f60;
  file_02.m_end = (iterator)0xe0;
  file_02.m_begin = (iterator)&local_368;
  msg_02.m_end = pvVar10;
  msg_02.m_begin = (iterator)output_03.m_size;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_378,
             msg_02);
  if ((long)c20_output.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)c20_output.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
            super__Vector_impl_data._M_start ==
      (long)fsc20_output.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)fsc20_output.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
            super__Vector_impl_data._M_start) {
    local_268.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(class_property<bool>)0x1;
    output_02.m_size =
         fsc20_output.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
         super__Vector_impl_data._M_start;
    for (output_00.m_size =
              c20_output.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
              super__Vector_impl_data._M_start;
        output_00.m_size !=
        c20_output.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
        super__Vector_impl_data._M_finish; output_00.m_size = output_00.m_size + 1) {
      if (*output_00.m_size != *output_02.m_size) goto LAB_00361fa5;
      output_02.m_size = output_02.m_size + 1;
    }
  }
  else {
LAB_00361fa5:
    local_268.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(class_property<bool>)0x0;
  }
  local_268.m_message.px = (element_type *)0x0;
  local_268.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_3c8._0_8_ = "c20_output == fsc20_output";
  local_3c8._8_8_ = "";
  local_240.m_message.px = (element_type *)((ulong)local_240.m_message.px & 0xffffffffffffff00);
  local_240._0_8_ = &PTR__lazy_ostream_013ae1c8;
  local_240.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_228 = (string **)local_3c8;
  local_388 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/crypto_tests.cpp";
  local_380 = "";
  pvVar10 = (iterator)0x1;
  pvVar11 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_268,(lazy_ostream *)&local_240,1,0,WARN,_cVar13,(size_t)&local_388,0xe0);
  boost::detail::shared_count::~shared_count(&local_268.m_message.pn);
  local_398 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/crypto_tests.cpp";
  local_390 = "";
  local_3a8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3a0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_03.m_end = (iterator)0xe2;
  file_03.m_begin = (iterator)&local_398;
  msg_03.m_end = pvVar11;
  msg_03.m_begin = pvVar10;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_3a8,
             msg_03);
  local_3c8._8_8_ = local_3c8._8_8_ & 0xffffffffffffff00;
  local_3c8._0_8_ = &PTR__lazy_ostream_013ae088;
  local_3b8 = boost::unit_test::lazy_ostream::inst;
  local_3b0 = "";
  s.m_size = (long)fsc20_output.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)fsc20_output.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                   super__Vector_impl_data._M_start;
  s.m_data = fsc20_output.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
             super__Vector_impl_data._M_start;
  HexStr_abi_cxx11_(&local_1f8,s);
  if (local_1f8._M_string_length == ciphertext_after_rotation->_M_string_length) {
    if (local_1f8._M_string_length == 0) {
      local_210.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
           (readonly_property<bool>)(class_property<bool>)0x1;
    }
    else {
      iVar4 = bcmp(local_1f8._M_dataplus._M_p,(ciphertext_after_rotation->_M_dataplus)._M_p,
                   local_1f8._M_string_length);
      local_210.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
           (readonly_property<bool>)(iVar4 == 0);
    }
  }
  else {
    local_210.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(class_property<bool>)0x0;
  }
  local_210.m_message.px = (element_type *)0x0;
  local_210.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_220 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/crypto_tests.cpp";
  local_218 = "";
  local_228 = &local_248;
  local_240.m_message.px = (element_type *)((ulong)local_240.m_message.px & 0xffffffffffffff00);
  local_240._0_8_ = &PTR__lazy_ostream_013ae148;
  local_240.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_250 = &local_270;
  local_268.m_message.px = (element_type *)((ulong)local_268.m_message.px & 0xffffffffffffff00);
  local_268._0_8_ = &PTR__lazy_ostream_013ae148;
  local_268.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_270 = ciphertext_after_rotation;
  local_248 = &local_1f8;
  boost::test_tools::tt_detail::report_assertion
            (&local_210,(lazy_ostream *)local_3c8,1,2,REQUIRE,0xe85216,(size_t)&local_220,0xe2,
             (lazy_ostream *)&local_240,"ciphertext_after_rotation",&local_268);
  boost::detail::shared_count::~shared_count(&local_210.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
    operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
  }
  ChaCha20::~ChaCha20(&c20_copy);
  if (c20_output.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(c20_output.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)c20_output.super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)c20_output.super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (fsc20_output.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(fsc20_output.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)fsc20_output.super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)fsc20_output.super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  ChaCha20::~ChaCha20(&c20);
  ChaCha20::~ChaCha20(&fsc20.m_chacha20);
  if (plaintext.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(plaintext.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)plaintext.super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)plaintext.super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (key.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(key.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)key.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)key.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void TestFSChaCha20(const std::string& hex_plaintext, const std::string& hexkey, uint32_t rekey_interval, const std::string& ciphertext_after_rotation)
{
    auto key = ParseHex<std::byte>(hexkey);
    BOOST_CHECK_EQUAL(FSChaCha20::KEYLEN, key.size());

    auto plaintext = ParseHex<std::byte>(hex_plaintext);

    auto fsc20 = FSChaCha20{key, rekey_interval};
    auto c20 = ChaCha20{key};

    std::vector<std::byte> fsc20_output;
    fsc20_output.resize(plaintext.size());

    std::vector<std::byte> c20_output;
    c20_output.resize(plaintext.size());

    for (size_t i = 0; i < rekey_interval; i++) {
        fsc20.Crypt(plaintext, fsc20_output);
        c20.Crypt(plaintext, c20_output);
        BOOST_CHECK(c20_output == fsc20_output);
    }

    // At the rotation interval, the outputs will no longer match
    fsc20.Crypt(plaintext, fsc20_output);
    auto c20_copy = c20;
    c20.Crypt(plaintext, c20_output);
    BOOST_CHECK(c20_output != fsc20_output);

    std::byte new_key[FSChaCha20::KEYLEN];
    c20_copy.Keystream(new_key);
    c20.SetKey(new_key);
    c20.Seek({0, 1}, 0);

    // Outputs should match again after simulating key rotation
    c20.Crypt(plaintext, c20_output);
    BOOST_CHECK(c20_output == fsc20_output);

    BOOST_CHECK_EQUAL(HexStr(fsc20_output), ciphertext_after_rotation);
}